

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.cpp
# Opt level: O2

string * __thiscall
cppassert::DefaultFormatter::formatBoolFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,DefaultFormatter *this,char *expressionText,
          char *actualPredicateValue,char *expectedPredicateValue)

{
  AssertionMessage *pAVar1;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  
  local_28 = expectedPredicateValue;
  local_20 = actualPredicateValue;
  local_18 = expressionText;
  internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_30);
  pAVar1 = internal::AssertionMessage::operator<<
                     ((AssertionMessage *)&local_30,(char (*) [29])"Assertion failure value of: ");
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&local_18);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char (*) [12])"\n  Actual: ");
  internal::AssertionMessage::operator<<(pAVar1,&local_20);
  pAVar1 = internal::AssertionMessage::operator<<
                     ((AssertionMessage *)&local_30,(char (*) [12])"\nExpected: ");
  internal::AssertionMessage::operator<<(pAVar1,&local_28);
  internal::AssertionMessage::str_abi_cxx11_(__return_storage_ptr__,(AssertionMessage *)&local_30);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_30._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultFormatter::formatBoolFailureMessage(const char* expressionText,
                                    const char* actualPredicateValue,
                                    const char* expectedPredicateValue)
{
    AssertionMessage msg;
    msg << "Assertion failure value of: " << expressionText
        << "\n  Actual: " << actualPredicateValue;
    msg << "\nExpected: " << expectedPredicateValue;
    return msg.str();
}